

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_LogicalConstant_Test::~ExprTest_LogicalConstant_Test(ExprTest_LogicalConstant_Test *this)

{
  void *in_RDI;
  
  ~ExprTest_LogicalConstant_Test((ExprTest_LogicalConstant_Test *)0x14a828);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, LogicalConstant) {
  mp::LogicalConstant e;
  EXPECT_TRUE(e == 0);
  (void)LogicalExpr(e);
  e = factory_.MakeLogicalConstant(false);
  EXPECT_EQ(expr::BOOL, e.kind());
  EXPECT_TRUE(e != 0);
  EXPECT_FALSE(e.value());
  EXPECT_TRUE(factory_.MakeLogicalConstant(true).value());
}